

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::lts_20250127::debugging_internal::ParsePrefix(State *state)

{
  bool bVar1;
  bool bVar2;
  bool has_something;
  ComplexityGuard guard;
  State *state_local;
  
  guard.state_ = state;
  anon_unknown_3::ComplexityGuard::ComplexityGuard
            ((ComplexityGuard *)&stack0xffffffffffffffe0,state);
  bVar1 = anon_unknown_3::ComplexityGuard::IsTooComplex((ComplexityGuard *)&stack0xffffffffffffffe0)
  ;
  if (bVar1) {
    state_local._7_1_ = false;
  }
  else {
    bVar1 = false;
    while( true ) {
      MaybeAppendSeparator(guard.state_);
      bVar2 = ParseTemplateParam(guard.state_);
      if (((((!bVar2) && (bVar2 = ParseDecltype(guard.state_), !bVar2)) &&
           (bVar2 = ParseSubstitution(guard.state_,true), !bVar2)) &&
          ((bVar2 = ParseVendorExtendedType(guard.state_), !bVar2 &&
           (bVar2 = ParseUnscopedName(guard.state_), !bVar2)))) &&
         ((bVar2 = ParseOneCharToken(guard.state_,'M'), !bVar2 ||
          (bVar2 = ParseUnnamedTypeName(guard.state_), !bVar2)))) break;
      bVar1 = true;
      MaybeIncreaseNestLevel(guard.state_);
    }
    MaybeCancelLastSeparator(guard.state_);
    if ((bVar1) && (bVar1 = ParseTemplateArgs(guard.state_), bVar1)) {
      state_local._7_1_ = ParsePrefix(guard.state_);
    }
    else {
      state_local._7_1_ = true;
    }
  }
  anon_unknown_3::ComplexityGuard::~ComplexityGuard((ComplexityGuard *)&stack0xffffffffffffffe0);
  return state_local._7_1_;
}

Assistant:

static bool ParsePrefix(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  bool has_something = false;
  while (true) {
    MaybeAppendSeparator(state);
    if (ParseTemplateParam(state) || ParseDecltype(state) ||
        ParseSubstitution(state, /*accept_std=*/true) ||
        // Although the official grammar does not mention it, nested-names
        // shaped like Nu14__some_builtinIiE6memberE occur in practice, and it
        // is not clear what else a compiler is supposed to do when a
        // vendor-extended type has named members.
        ParseVendorExtendedType(state) ||
        ParseUnscopedName(state) ||
        (ParseOneCharToken(state, 'M') && ParseUnnamedTypeName(state))) {
      has_something = true;
      MaybeIncreaseNestLevel(state);
      continue;
    }
    MaybeCancelLastSeparator(state);
    if (has_something && ParseTemplateArgs(state)) {
      return ParsePrefix(state);
    } else {
      break;
    }
  }
  return true;
}